

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition_XYZfunctions.cpp
# Opt level: O3

void __thiscall
chrono::ChFunctionPosition_XYZfunctions::ArchiveOUT
          (ChFunctionPosition_XYZfunctions *this,ChArchiveOut *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChFunctionPosition>(marchive);
  ChFunctionPosition::ArchiveOUT(&this->super_ChFunctionPosition,marchive);
  local_38._value = &this->px;
  local_38._name = "px";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFunction>(marchive,&local_38);
  local_38._value = &this->py;
  local_38._name = "py";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFunction>(marchive,&local_38);
  local_38._value = &this->pz;
  local_38._name = "pz";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFunction>(marchive,&local_38);
  return;
}

Assistant:

void ChFunctionPosition_XYZfunctions::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunctionPosition>();
	// serialize parent class
    ChFunctionPosition::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(px);
	marchive << CHNVP(py);
	marchive << CHNVP(pz);
}